

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

wstring * __thiscall
(anonymous_namespace)::t_debugger::f_read_string_abi_cxx11_
          (wstring *__return_storage_ptr__,void *this,wint_t *a_c,wchar_t a_terminator)

{
  wint_t wVar1;
  bool bVar2;
  wchar_t a_terminator_local;
  wint_t *a_c_local;
  t_debugger *this_local;
  wstring *s;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  while( true ) {
    bVar2 = false;
    if (*a_c != 0xffffffff) {
      bVar2 = *a_c != a_terminator;
    }
    if (!bVar2) break;
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
    push_back(__return_storage_ptr__,*a_c);
    wVar1 = getwchar();
    *a_c = wVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring f_read_string(wint_t& a_c, wchar_t a_terminator)
	{
		std::wstring s;
		while (a_c != WEOF && a_c != a_terminator) {
			s.push_back(a_c);
			a_c = std::getwchar();
		}
		return s;
	}